

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<unsigned_int,_unsigned_int,_THashTraits<unsigned_int>,_TValueTraits<unsigned_int>_>::GetNode
          (TMap<unsigned_int,_unsigned_int,_THashTraits<unsigned_int>,_TValueTraits<unsigned_int>_>
           *this,uint key)

{
  TValueTraits<unsigned_int> local_29;
  TMap<unsigned_int,_unsigned_int,_THashTraits<unsigned_int>,_TValueTraits<unsigned_int>_>
  *pTStack_28;
  TValueTraits<unsigned_int> traits;
  Node *n;
  uint key_local;
  TMap<unsigned_int,_unsigned_int,_THashTraits<unsigned_int>,_TValueTraits<unsigned_int>_>
  *this_local;
  
  pTStack_28 = (TMap<unsigned_int,_unsigned_int,_THashTraits<unsigned_int>,_TValueTraits<unsigned_int>_>
                *)FindKey(this,key);
  this_local = pTStack_28;
  if (pTStack_28 ==
      (TMap<unsigned_int,_unsigned_int,_THashTraits<unsigned_int>,_TValueTraits<unsigned_int>_> *)
      0x0) {
    pTStack_28 = (TMap<unsigned_int,_unsigned_int,_THashTraits<unsigned_int>,_TValueTraits<unsigned_int>_>
                  *)NewKey(this,key);
    TValueTraits<unsigned_int>::Init(&local_29,&((IPair *)&pTStack_28->LastFree)->Value);
    this_local = pTStack_28;
  }
  return (Node *)this_local;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}